

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSeqCleanup(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_5c;
  uint local_58;
  int fVeryVerbose;
  int fVerbose;
  int nFramesSatur;
  int nFramesSymb;
  int fUseMvSweep;
  int fSaveNames;
  int fLatchEqual;
  int fLatchConst;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fSaveNames = 1;
  fUseMvSweep = 1;
  nFramesSymb = 1;
  nFramesSatur = 0;
  fVerbose = 1;
  fVeryVerbose = 0x200;
  local_58 = 0;
  local_5c = 0;
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
LAB_00247b52:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"cenmFSvwh");
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"Only works for structrally hashed networks.\n");
        return 1;
      }
      iVar1 = Abc_NtkLatchNum(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"The network is combinational.\n");
        return 0;
      }
      pAVar2 = Abc_NtkDarLatchSweep
                         (pAVar2,fSaveNames,fUseMvSweep,nFramesSymb,nFramesSatur,fVerbose,
                          fVeryVerbose,local_58,local_5c);
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Sequential cleanup has failed.\n");
        return 1;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      return 0;
    }
    switch(iVar1) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_00247db3;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      iVar1 = fVerbose;
      break;
    default:
      goto LAB_00247db3;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_00247db3;
      }
      fVeryVerbose = atoi(argv[globalUtilOptind]);
      iVar1 = fVeryVerbose;
      break;
    case 99:
      fSaveNames = fSaveNames ^ 1;
      goto LAB_00247b52;
    case 0x65:
      fUseMvSweep = fUseMvSweep ^ 1;
      goto LAB_00247b52;
    case 0x68:
      goto LAB_00247db3;
    case 0x6d:
      nFramesSatur = nFramesSatur ^ 1;
      goto LAB_00247b52;
    case 0x6e:
      nFramesSymb = nFramesSymb ^ 1;
      goto LAB_00247b52;
    case 0x76:
      local_58 = local_58 ^ 1;
      goto LAB_00247b52;
    case 0x77:
      local_5c = local_5c ^ 1;
      goto LAB_00247b52;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_00247db3:
      Abc_Print(-2,"usage: scleanup [-cenmFSvwh]\n");
      Abc_Print(-2,"\t         performs sequential cleanup of the current network\n");
      Abc_Print(-2,"\t         by removing nodes and latches that do not feed into POs\n");
      pcVar3 = "no";
      if (fSaveNames != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,
                "\t-c     : sweep stuck-at latches detected by ternary simulation [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (fUseMvSweep != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,
                "\t-e     : merge equal latches (same data inputs and init states) [default = %s]\n"
                ,pcVar3);
      pcVar3 = "no";
      if (nFramesSymb != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggle preserving latch names [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (nFramesSatur != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggle using hybrid ternary/symbolic simulation [default = %s]\n",
                pcVar3);
      Abc_Print(-2,"\t-F num : the number of first frames simulated symbolically [default = %d]\n",
                (ulong)(uint)fVerbose);
      Abc_Print(-2,
                "\t-S num : the number of frames when symbolic saturation begins [default = %d]\n",
                (ulong)(uint)fVeryVerbose);
      pcVar3 = "no";
      if (local_58 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_5c != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggle very verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSeqCleanup( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fLatchConst  =   1;
    int fLatchEqual  =   1;
    int fSaveNames   =   1;
    int fUseMvSweep  =   0;
    int nFramesSymb  =   1;
    int nFramesSatur = 512;
    int fVerbose     =   0;
    int fVeryVerbose =   0;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cenmFSvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fLatchConst ^= 1;
            break;
        case 'e':
            fLatchEqual ^= 1;
            break;
        case 'n':
            fSaveNames ^= 1;
            break;
        case 'm':
            fUseMvSweep ^= 1;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesSymb = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesSymb < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesSatur = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesSatur < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for structrally hashed networks.\n" );
        return 1;
    }
    if ( !Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    // modify the current network
    pNtkRes = Abc_NtkDarLatchSweep( pNtk, fLatchConst, fLatchEqual, fSaveNames, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential cleanup has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: scleanup [-cenmFSvwh]\n" );
    Abc_Print( -2, "\t         performs sequential cleanup of the current network\n" );
    Abc_Print( -2, "\t         by removing nodes and latches that do not feed into POs\n" );
    Abc_Print( -2, "\t-c     : sweep stuck-at latches detected by ternary simulation [default = %s]\n", fLatchConst? "yes": "no" );
    Abc_Print( -2, "\t-e     : merge equal latches (same data inputs and init states) [default = %s]\n", fLatchEqual? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle preserving latch names [default = %s]\n", fSaveNames? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using hybrid ternary/symbolic simulation [default = %s]\n", fUseMvSweep? "yes": "no" );
    Abc_Print( -2, "\t-F num : the number of first frames simulated symbolically [default = %d]\n", nFramesSymb );
    Abc_Print( -2, "\t-S num : the number of frames when symbolic saturation begins [default = %d]\n", nFramesSatur );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle very verbose output [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}